

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O2

void get_CH(double *p1,int n,int *ch1)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  dVar4 = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar5 = p1[uVar2 + 1] * p1[uVar2 + 1];
    p1[uVar2 + 1] = dVar5;
    dVar4 = dVar4 + dVar5;
  }
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    p1[uVar2 + 1] = p1[uVar2 + 1] / dVar4;
  }
  iVar1 = rand();
  dVar4 = 0.0;
  uVar2 = 0;
  while( true ) {
    if (uVar3 == uVar2) {
      return;
    }
    dVar4 = dVar4 + p1[uVar2 + 1];
    if ((double)(iVar1 % 10000) / 10000.0 < dVar4) break;
    uVar2 = uVar2 + 1;
  }
  *ch1 = (int)uVar2;
  return;
}

Assistant:

void get_CH(double *p1, int n, int &ch1)
{
    double sum;
    double rd;
    int i;
    if(CHOOSE_TYPE==1)
    {
        sum = 0;
        rd = (double)(rand()%10000) / 10000.0;
        for (i = 1; i <= n; i++)
            if(sum + p1[i] > rd)
            {
                ch1 = i - 1;
                break;
            }
            else sum += p1[i];
    }
    else if(CHOOSE_TYPE==2||CHOOSE_TYPE==4)//把概率平方处理
    {
        //先平方，然后归一化一下
        sum = 0;
        for (i = 1; i <= n; i++)
        {
            if(CHOOSE_TYPE==2)
                p1[i]=p1[i]*p1[i];
            else p1[i]=pow(p1[i],1.5);
            sum+=p1[i];
        }
        for (i = 1; i <= n; i++)
            p1[i]=p1[i]/sum;
        sum=0;

        rd = (double)(rand()%10000) / 10000.0;
        for (i = 1; i <= n; i++)
            if(sum + p1[i] > rd)
            {
                ch1 = i - 1;
                break;
            }
            else sum += p1[i];
    }
    else if(CHOOSE_TYPE==3)//直接选个概率最大的。。。
    {
        double max_pro=0;
        for (i = 1; i <= n; i++)
            if(p1[i] > max_pro)
            {
                max_pro=p1[i];
                ch1=i-1;
            }
    }
}